

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall cmGlobalUnixMakefileGenerator3::Configure(cmGlobalUnixMakefileGenerator3 *this)

{
  long *local_30 [2];
  long local_20 [2];
  
  (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x24])
            (local_30,this);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  cmGlobalGenerator::Configure((cmGlobalGenerator *)this);
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::Configure()
{
  // Initialize CMAKE_EDIT_COMMAND cache entry.
  this->GetEditCacheCommand();

  this->cmGlobalGenerator::Configure();
}